

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_SAX2(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  size_t sVar36;
  long lVar37;
  undefined4 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  int n_defaultValue;
  uint uVar41;
  int iVar42;
  char *pcVar43;
  undefined4 *puVar44;
  ulong uVar45;
  ulong uVar46;
  int n_value;
  uint uVar47;
  undefined8 uVar48;
  undefined4 uVar49;
  undefined8 uVar50;
  xmlChar *pxVar51;
  undefined4 uVar52;
  int n_len;
  undefined8 *puVar53;
  ulong uVar54;
  int test_ret_10;
  int *piVar55;
  int n_content;
  bool bVar56;
  uint local_64;
  int test_ret_3;
  int test_ret_2;
  int test_ret_5;
  int test_ret_1;
  int test_ret;
  
  if (quiet == '\0') {
    puts("Testing SAX2 : 38 of 38 functions ...");
  }
  iVar1 = xmlMemBlocks();
  docbDefaultSAXHandlerInit();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar3 = xmlMemBlocks();
    printf("Leak of %d blocks found in docbDefaultSAXHandlerInit",(ulong)(uint)(iVar3 - iVar1));
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  htmlDefaultSAXHandlerInit();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    iVar5 = xmlMemBlocks();
    printf("Leak of %d blocks found in htmlDefaultSAXHandlerInit",(ulong)(uint)(iVar5 - iVar3));
    putchar(10);
  }
  local_64 = (uint)(iVar3 != iVar4);
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  xmlDefaultSAXHandlerInit();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    iVar5 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlDefaultSAXHandlerInit",(ulong)(uint)(iVar5 - iVar3));
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  _test_ret_5 = 0;
  do {
    uVar8 = 0;
    do {
      uVar46 = 0;
      do {
        uVar47 = 0;
        do {
          uVar45 = 0;
          do {
            uVar41 = 0;
            puVar53 = &DAT_00165d70;
            do {
              iVar6 = xmlMemBlocks();
              if (uVar8 < 4) {
                uVar48 = (&DAT_00165d70)[uVar8];
              }
              else {
                uVar48 = 0;
              }
              if ((uint)uVar46 < 4) {
                uVar40 = (&DAT_00165d70)[uVar46];
              }
              else {
                uVar40 = 0;
              }
              uVar49 = 0xffffffff;
              uVar38 = 0xffffffff;
              if (uVar47 < 4) {
                uVar38 = (&DAT_00163454)[uVar47];
              }
              if ((uint)uVar45 < 4) {
                uVar49 = (&DAT_00163454)[uVar45];
              }
              if (uVar41 < 4) {
                uVar39 = *puVar53;
              }
              else {
                uVar39 = 0;
              }
              xmlSAX2AttributeDecl(0,uVar48,uVar40,uVar38,uVar49,uVar39,0);
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar7 = xmlMemBlocks();
              if (iVar6 != iVar7) {
                iVar7 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlSAX2AttributeDecl",
                       (ulong)(uint)(iVar7 - iVar6));
                iVar5 = iVar5 + 1;
                printf(" %d",_test_ret_5);
                printf(" %d",(ulong)uVar8);
                printf(" %d",uVar46);
                printf(" %d",(ulong)uVar47);
                printf(" %d",uVar45);
                printf(" %d");
                printf(" %d");
                putchar(10);
              }
              uVar41 = uVar41 + 1;
              puVar53 = puVar53 + 1;
            } while (uVar41 != 5);
            uVar41 = (uint)uVar45 + 1;
            uVar45 = (ulong)uVar41;
          } while (uVar41 != 4);
          uVar47 = uVar47 + 1;
        } while (uVar47 != 4);
        uVar47 = (uint)uVar46 + 1;
        uVar46 = (ulong)uVar47;
      } while (uVar47 != 5);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 5);
    iVar6 = (int)_test_ret_5;
    _test_ret_5 = (ulong)(iVar6 + 1);
  } while (iVar6 == 0);
  function_tests = function_tests + 1;
  iVar6 = 0;
  _test_ret_5 = 0;
  do {
    uVar8 = 0;
    do {
      uVar46 = 0;
      piVar55 = &DAT_00163454;
      do {
        iVar7 = xmlMemBlocks();
        switch(uVar8) {
        case 0:
          bVar56 = false;
          pcVar43 = "foo";
          break;
        case 1:
          bVar56 = false;
          pcVar43 = "<foo/>";
          break;
        case 2:
          bVar56 = false;
          pcVar43 = anon_var_dwarf_1b3;
          break;
        case 3:
          bVar56 = false;
          pcVar43 = " 2ab ";
          break;
        default:
          bVar56 = true;
          pcVar43 = (char *)0x0;
        }
        iVar9 = -1;
        if ((uint)uVar46 < 4) {
          iVar9 = *piVar55;
        }
        if ((bVar56) || (sVar36 = strlen(pcVar43), iVar9 <= (int)sVar36 + 1)) {
          xmlSAX2CDataBlock(0,pcVar43,iVar9);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar9 = xmlMemBlocks();
          if (iVar7 != iVar9) {
            iVar9 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2CDataBlock",(ulong)(uint)(iVar9 - iVar7));
            iVar6 = iVar6 + 1;
            printf(" %d",_test_ret_5);
            printf(" %d",(ulong)uVar8);
            printf(" %d",uVar46);
            putchar(10);
          }
        }
        uVar47 = (uint)uVar46 + 1;
        uVar46 = (ulong)uVar47;
        piVar55 = piVar55 + 1;
      } while (uVar47 != 4);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 5);
    iVar7 = (int)_test_ret_5;
    _test_ret_5 = (ulong)(iVar7 + 1);
  } while (iVar7 == 0);
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  _test_ret_5 = 0;
  do {
    uVar8 = 0;
    do {
      uVar46 = 0;
      piVar55 = &DAT_00163454;
      do {
        iVar7 = xmlMemBlocks();
        switch(uVar8) {
        case 0:
          bVar56 = false;
          pcVar43 = "foo";
          break;
        case 1:
          bVar56 = false;
          pcVar43 = "<foo/>";
          break;
        case 2:
          bVar56 = false;
          pcVar43 = anon_var_dwarf_1b3;
          break;
        case 3:
          bVar56 = false;
          pcVar43 = " 2ab ";
          break;
        default:
          bVar56 = true;
          pcVar43 = (char *)0x0;
        }
        iVar9 = -1;
        if ((uint)uVar46 < 4) {
          iVar9 = *piVar55;
        }
        if ((bVar56) || (sVar36 = strlen(pcVar43), iVar9 <= (int)sVar36 + 1)) {
          xmlSAX2Characters(0,pcVar43,iVar9);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar9 = xmlMemBlocks();
          if (iVar7 != iVar9) {
            iVar9 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2Characters",(ulong)(uint)(iVar9 - iVar7));
            test_ret_1 = test_ret_1 + 1;
            printf(" %d",_test_ret_5);
            printf(" %d",(ulong)uVar8);
            printf(" %d",uVar46);
            putchar(10);
          }
        }
        uVar47 = (uint)uVar46 + 1;
        uVar46 = (ulong)uVar47;
        piVar55 = piVar55 + 1;
      } while (uVar47 != 4);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 5);
    iVar7 = (int)_test_ret_5;
    _test_ret_5 = (ulong)(iVar7 + 1);
  } while (iVar7 == 0);
  function_tests = function_tests + 1;
  iVar7 = 0;
  uVar8 = 0;
  do {
    puVar53 = &DAT_00165d70;
    uVar47 = 0;
    do {
      iVar9 = xmlMemBlocks();
      if (uVar47 < 4) {
        uVar48 = *puVar53;
      }
      else {
        uVar48 = 0;
      }
      xmlSAX2Comment(0,uVar48);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar9 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAX2Comment",(ulong)(uint)(iVar10 - iVar9));
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar8);
        printf(" %d");
        putchar(10);
      }
      uVar47 = uVar47 + 1;
      puVar53 = puVar53 + 1;
    } while (uVar47 != 5);
    bVar56 = uVar8 == 0;
    uVar8 = uVar8 + 1;
  } while (bVar56);
  function_tests = function_tests + 1;
  iVar9 = 0;
  uVar8 = 0;
  do {
    uVar47 = 0;
    do {
      uVar41 = 0;
      puVar44 = &DAT_00163454;
      do {
        iVar10 = xmlMemBlocks();
        if (uVar47 < 4) {
          uVar48 = (&DAT_00165d70)[uVar47];
        }
        else {
          uVar48 = 0;
        }
        uVar38 = 0xffffffff;
        if (uVar41 < 4) {
          uVar38 = *puVar44;
        }
        xmlSAX2ElementDecl(0,uVar48,uVar38,0);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar11 = xmlMemBlocks();
        if (iVar10 != iVar11) {
          iVar11 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAX2ElementDecl",(ulong)(uint)(iVar11 - iVar10));
          iVar9 = iVar9 + 1;
          printf(" %d",(ulong)uVar8);
          printf(" %d",(ulong)uVar47);
          printf(" %d");
          printf(" %d");
          putchar(10);
        }
        uVar41 = uVar41 + 1;
        puVar44 = puVar44 + 1;
      } while (uVar41 != 4);
      uVar47 = uVar47 + 1;
    } while (uVar47 != 5);
    bVar56 = uVar8 == 0;
    uVar8 = uVar8 + 1;
  } while (bVar56);
  function_tests = function_tests + 1;
  uVar8 = 0;
  iVar10 = 0;
  do {
    iVar11 = xmlMemBlocks();
    xmlSAX2EndDocument(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar11 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2EndDocument",(ulong)(uint)(iVar12 - iVar11));
      iVar10 = iVar10 + 1;
      printf(" %d",(ulong)uVar8);
      putchar(10);
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 == 1);
  function_tests = function_tests + 1;
  iVar11 = 0;
  uVar46 = 0;
  do {
    puVar53 = &DAT_00165d70;
    uVar8 = 0;
    do {
      iVar12 = xmlMemBlocks();
      if (uVar8 < 4) {
        uVar48 = *puVar53;
      }
      else {
        uVar48 = 0;
      }
      xmlSAX2EndElement(0,uVar48);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar13 = xmlMemBlocks();
      iVar14 = (int)uVar46;
      if (iVar12 != iVar13) {
        iVar13 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAX2EndElement",(ulong)(uint)(iVar13 - iVar12));
        iVar11 = iVar11 + 1;
        printf(" %d",uVar46);
        printf(" %d");
        putchar(10);
      }
      uVar8 = uVar8 + 1;
      puVar53 = puVar53 + 1;
    } while (uVar8 != 5);
    uVar46 = (ulong)(iVar14 + 1);
  } while (iVar14 == 0);
  function_tests = function_tests + 1;
  iVar12 = 0;
  _test_ret_3 = 0;
  do {
    uVar8 = 0;
    do {
      uVar46 = 0;
      do {
        puVar53 = &DAT_00165d70;
        uVar47 = 0;
        do {
          iVar13 = xmlMemBlocks();
          if (uVar8 < 4) {
            uVar48 = (&DAT_00165d70)[uVar8];
          }
          else {
            uVar48 = 0;
          }
          if ((uint)uVar46 < 4) {
            uVar40 = (&DAT_00165d70)[uVar46];
          }
          else {
            uVar40 = 0;
          }
          if (uVar47 < 4) {
            uVar39 = *puVar53;
          }
          else {
            uVar39 = 0;
          }
          xmlSAX2EndElementNs(0,uVar48,uVar40,uVar39);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar14 = xmlMemBlocks();
          if (iVar13 != iVar14) {
            iVar14 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2EndElementNs",(ulong)(uint)(iVar14 - iVar13));
            iVar12 = iVar12 + 1;
            printf(" %d",_test_ret_3);
            printf(" %d",(ulong)uVar8);
            printf(" %d",uVar46);
            printf(" %d");
            putchar(10);
          }
          uVar47 = uVar47 + 1;
          puVar53 = puVar53 + 1;
        } while (uVar47 != 5);
        uVar47 = (uint)uVar46 + 1;
        uVar46 = (ulong)uVar47;
      } while (uVar47 != 5);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 5);
    iVar13 = (int)_test_ret_3;
    _test_ret_3 = (ulong)(iVar13 + 1);
  } while (iVar13 == 0);
  function_tests = function_tests + 1;
  iVar13 = 0;
  _test_ret_2 = 0;
  do {
    uVar8 = 0;
    do {
      uVar46 = 0;
      do {
        uVar47 = 0;
        do {
          uVar45 = 0;
          do {
            iVar14 = 0;
            do {
              iVar15 = xmlMemBlocks();
              if (uVar8 < 4) {
                uVar48 = (&DAT_00165d70)[uVar8];
              }
              else {
                uVar48 = 0;
              }
              uVar38 = 0xffffffff;
              if ((uint)uVar46 < 4) {
                uVar38 = (&DAT_00163454)[uVar46];
              }
              if (uVar47 < 4) {
                uVar40 = (&DAT_00165d70)[uVar47];
              }
              else {
                uVar40 = 0;
              }
              if ((uint)uVar45 < 4) {
                uVar39 = (&DAT_00165d70)[uVar45];
              }
              else {
                uVar39 = 0;
              }
              pxVar51 = (xmlChar *)0x0;
              if (iVar14 == 0) {
                pxVar51 = chartab;
              }
              xmlSAX2EntityDecl(0,uVar48,uVar38,uVar40,uVar39,pxVar51);
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar16 = xmlMemBlocks();
              if (iVar15 != iVar16) {
                iVar16 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlSAX2EntityDecl",(ulong)(uint)(iVar16 - iVar15)
                      );
                iVar13 = iVar13 + 1;
                printf(" %d",_test_ret_2);
                printf(" %d",(ulong)uVar8);
                printf(" %d",uVar46);
                printf(" %d",(ulong)uVar47);
                printf(" %d",uVar45);
                printf(" %d");
                putchar(10);
              }
              iVar14 = iVar14 + 1;
            } while (iVar14 == 1);
            uVar41 = (uint)uVar45 + 1;
            uVar45 = (ulong)uVar41;
          } while (uVar41 != 5);
          uVar47 = uVar47 + 1;
        } while (uVar47 != 5);
        uVar47 = (uint)uVar46 + 1;
        uVar46 = (ulong)uVar47;
      } while (uVar47 != 4);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 5);
    iVar14 = (int)_test_ret_2;
    _test_ret_2 = (ulong)(iVar14 + 1);
  } while (iVar14 == 0);
  function_tests = function_tests + 1;
  iVar14 = 0;
  _test_ret_2 = 0;
  do {
    uVar8 = 0;
    do {
      uVar46 = 0;
      do {
        puVar53 = &DAT_00165d70;
        uVar47 = 0;
        do {
          iVar15 = xmlMemBlocks();
          if (uVar8 < 4) {
            uVar48 = (&DAT_00165d70)[uVar8];
          }
          else {
            uVar48 = 0;
          }
          if ((uint)uVar46 < 4) {
            uVar40 = (&DAT_00165d70)[uVar46];
          }
          else {
            uVar40 = 0;
          }
          if (uVar47 < 4) {
            uVar39 = *puVar53;
          }
          else {
            uVar39 = 0;
          }
          xmlSAX2ExternalSubset(0,uVar48,uVar40,uVar39);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar16 = xmlMemBlocks();
          if (iVar15 != iVar16) {
            iVar16 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2ExternalSubset",(ulong)(uint)(iVar16 - iVar15)
                  );
            iVar14 = iVar14 + 1;
            printf(" %d",_test_ret_2);
            printf(" %d",(ulong)uVar8);
            printf(" %d",uVar46);
            printf(" %d");
            putchar(10);
          }
          uVar47 = uVar47 + 1;
          puVar53 = puVar53 + 1;
        } while (uVar47 != 5);
        uVar47 = (uint)uVar46 + 1;
        uVar46 = (ulong)uVar47;
      } while (uVar47 != 5);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 5);
    iVar15 = (int)_test_ret_2;
    _test_ret_2 = (ulong)(iVar15 + 1);
  } while (iVar15 == 0);
  function_tests = function_tests + 1;
  uVar8 = 0;
  iVar15 = 0;
  do {
    iVar16 = xmlMemBlocks();
    xmlSAX2GetColumnNumber(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar17 = xmlMemBlocks();
    if (iVar16 != iVar17) {
      iVar17 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2GetColumnNumber",(ulong)(uint)(iVar17 - iVar16));
      iVar15 = iVar15 + 1;
      printf(" %d",(ulong)uVar8);
      putchar(10);
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 == 1);
  function_tests = function_tests + 1;
  iVar16 = 0;
  uVar46 = 0;
  do {
    puVar53 = &DAT_00165d70;
    uVar8 = 0;
    do {
      iVar17 = xmlMemBlocks();
      if (uVar8 < 4) {
        uVar48 = *puVar53;
      }
      else {
        uVar48 = 0;
      }
      lVar37 = xmlSAX2GetEntity(0,uVar48);
      if (lVar37 != 0) {
        xmlUnlinkNode(lVar37);
        xmlFreeNode();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar18 = xmlMemBlocks();
      iVar19 = (int)uVar46;
      if (iVar17 != iVar18) {
        iVar18 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAX2GetEntity",(ulong)(uint)(iVar18 - iVar17));
        iVar16 = iVar16 + 1;
        printf(" %d",uVar46);
        printf(" %d");
        putchar(10);
      }
      uVar8 = uVar8 + 1;
      puVar53 = puVar53 + 1;
    } while (uVar8 != 5);
    uVar46 = (ulong)(iVar19 + 1);
  } while (iVar19 == 0);
  function_tests = function_tests + 1;
  uVar8 = 0;
  iVar17 = 0;
  do {
    iVar18 = xmlMemBlocks();
    xmlSAX2GetLineNumber(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar18 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2GetLineNumber",(ulong)(uint)(iVar19 - iVar18));
      iVar17 = iVar17 + 1;
      printf(" %d",(ulong)uVar8);
      putchar(10);
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 == 1);
  function_tests = function_tests + 1;
  iVar18 = 0;
  uVar46 = 0;
  do {
    puVar53 = &DAT_00165d70;
    uVar8 = 0;
    do {
      iVar19 = xmlMemBlocks();
      if (uVar8 < 4) {
        uVar48 = *puVar53;
      }
      else {
        uVar48 = 0;
      }
      lVar37 = xmlSAX2GetParameterEntity(0,uVar48);
      if (lVar37 != 0) {
        xmlUnlinkNode(lVar37);
        xmlFreeNode();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar20 = xmlMemBlocks();
      iVar21 = (int)uVar46;
      if (iVar19 != iVar20) {
        iVar20 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAX2GetParameterEntity",(ulong)(uint)(iVar20 - iVar19)
              );
        iVar18 = iVar18 + 1;
        printf(" %d",uVar46);
        printf(" %d");
        putchar(10);
      }
      uVar8 = uVar8 + 1;
      puVar53 = puVar53 + 1;
    } while (uVar8 != 5);
    uVar46 = (ulong)(iVar21 + 1);
  } while (iVar21 == 0);
  function_tests = function_tests + 1;
  uVar8 = 0;
  iVar19 = 0;
  do {
    iVar20 = xmlMemBlocks();
    xmlSAX2GetPublicId(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar21 = xmlMemBlocks();
    if (iVar20 != iVar21) {
      iVar21 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2GetPublicId",(ulong)(uint)(iVar21 - iVar20));
      iVar19 = iVar19 + 1;
      printf(" %d",(ulong)uVar8);
      putchar(10);
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 == 1);
  function_tests = function_tests + 1;
  uVar8 = 0;
  iVar20 = 0;
  do {
    iVar21 = xmlMemBlocks();
    xmlSAX2GetSystemId(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar22 = xmlMemBlocks();
    if (iVar21 != iVar22) {
      iVar22 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2GetSystemId",(ulong)(uint)(iVar22 - iVar21));
      iVar20 = iVar20 + 1;
      printf(" %d",(ulong)uVar8);
      putchar(10);
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 == 1);
  function_tests = function_tests + 1;
  uVar8 = 0;
  iVar21 = 0;
  do {
    iVar22 = xmlMemBlocks();
    xmlSAX2HasExternalSubset(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar23 = xmlMemBlocks();
    if (iVar22 != iVar23) {
      iVar23 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2HasExternalSubset",(ulong)(uint)(iVar23 - iVar22));
      iVar21 = iVar21 + 1;
      printf(" %d",(ulong)uVar8);
      putchar(10);
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 == 1);
  function_tests = function_tests + 1;
  uVar8 = 0;
  iVar22 = 0;
  do {
    iVar23 = xmlMemBlocks();
    xmlSAX2HasInternalSubset(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar24 = xmlMemBlocks();
    if (iVar23 != iVar24) {
      iVar24 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2HasInternalSubset",(ulong)(uint)(iVar24 - iVar23));
      iVar22 = iVar22 + 1;
      printf(" %d",(ulong)uVar8);
      putchar(10);
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 == 1);
  function_tests = function_tests + 1;
  iVar23 = 0;
  _test_ret_2 = 0;
  do {
    uVar8 = 0;
    do {
      uVar47 = 0;
      piVar55 = &DAT_00163454;
      do {
        iVar24 = xmlMemBlocks();
        switch(uVar8) {
        case 0:
          bVar56 = false;
          pcVar43 = "foo";
          break;
        case 1:
          bVar56 = false;
          pcVar43 = "<foo/>";
          break;
        case 2:
          bVar56 = false;
          pcVar43 = anon_var_dwarf_1b3;
          break;
        case 3:
          bVar56 = false;
          pcVar43 = " 2ab ";
          break;
        default:
          bVar56 = true;
          pcVar43 = (char *)0x0;
        }
        iVar25 = -1;
        if (uVar47 < 4) {
          iVar25 = *piVar55;
        }
        if ((bVar56) || (sVar36 = strlen(pcVar43), iVar25 <= (int)sVar36 + 1)) {
          xmlSAX2IgnorableWhitespace(0,pcVar43,iVar25);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar25 = xmlMemBlocks();
          if (iVar24 != iVar25) {
            iVar25 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2IgnorableWhitespace",
                   (ulong)(uint)(iVar25 - iVar24));
            iVar23 = iVar23 + 1;
            printf(" %d",_test_ret_2);
            printf(" %d",(ulong)uVar8);
            printf(" %d",(ulong)uVar47);
            putchar(10);
          }
        }
        uVar47 = uVar47 + 1;
        piVar55 = piVar55 + 1;
      } while (uVar47 != 4);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 5);
    iVar24 = (int)_test_ret_2;
    _test_ret_2 = (ulong)(iVar24 + 1);
  } while (iVar24 == 0);
  function_tests = function_tests + 1;
  puVar44 = &DAT_00163454;
  uVar8 = 0;
  iVar24 = 0;
  do {
    iVar25 = xmlMemBlocks();
    uVar38 = 0xffffffff;
    if (uVar8 < 4) {
      uVar38 = *puVar44;
    }
    xmlSAX2InitDefaultSAXHandler(0,uVar38);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar26 = xmlMemBlocks();
    if (iVar25 != iVar26) {
      iVar26 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2InitDefaultSAXHandler",
             (ulong)(uint)(iVar26 - iVar25));
      iVar24 = iVar24 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar8);
      putchar(10);
    }
    uVar8 = uVar8 + 1;
    puVar44 = puVar44 + 1;
  } while (uVar8 != 4);
  function_tests = function_tests + 1;
  iVar25 = xmlMemBlocks();
  xmlSAX2InitDocbDefaultSAXHandler(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar26 = xmlMemBlocks();
  if (iVar25 != iVar26) {
    iVar27 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSAX2InitDocbDefaultSAXHandler",
           (ulong)(uint)(iVar27 - iVar25));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar27 = xmlMemBlocks();
  xmlSAX2InitHtmlDefaultSAXHandler(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar28 = xmlMemBlocks();
  if (iVar27 != iVar28) {
    iVar29 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSAX2InitHtmlDefaultSAXHandler",
           (ulong)(uint)(iVar29 - iVar27));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar29 = 0;
  _test_ret_3 = 0;
  do {
    uVar8 = 0;
    do {
      uVar47 = 0;
      do {
        puVar53 = &DAT_00165d70;
        uVar41 = 0;
        do {
          iVar30 = xmlMemBlocks();
          if (uVar8 < 4) {
            uVar48 = (&DAT_00165d70)[uVar8];
          }
          else {
            uVar48 = 0;
          }
          if (uVar47 < 4) {
            uVar40 = (&DAT_00165d70)[uVar47];
          }
          else {
            uVar40 = 0;
          }
          if (uVar41 < 4) {
            uVar39 = *puVar53;
          }
          else {
            uVar39 = 0;
          }
          xmlSAX2InternalSubset(0,uVar48,uVar40,uVar39);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar31 = xmlMemBlocks();
          if (iVar30 != iVar31) {
            iVar31 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2InternalSubset",(ulong)(uint)(iVar31 - iVar30)
                  );
            iVar29 = iVar29 + 1;
            printf(" %d",_test_ret_3);
            printf(" %d",(ulong)uVar8);
            printf(" %d",(ulong)uVar47);
            printf(" %d");
            putchar(10);
          }
          uVar41 = uVar41 + 1;
          puVar53 = puVar53 + 1;
        } while (uVar41 != 5);
        uVar47 = uVar47 + 1;
      } while (uVar47 != 5);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 5);
    iVar30 = (int)_test_ret_3;
    _test_ret_3 = (ulong)(iVar30 + 1);
  } while (iVar30 == 0);
  function_tests = function_tests + 1;
  uVar8 = 0;
  iVar30 = 0;
  do {
    iVar31 = xmlMemBlocks();
    xmlSAX2IsStandalone(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar32 = xmlMemBlocks();
    if (iVar31 != iVar32) {
      iVar32 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2IsStandalone",(ulong)(uint)(iVar32 - iVar31));
      iVar30 = iVar30 + 1;
      printf(" %d",(ulong)uVar8);
      putchar(10);
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 == 1);
  function_tests = function_tests + 1;
  iVar31 = 0;
  _test_ret_3 = 0;
  do {
    uVar8 = 0;
    do {
      uVar47 = 0;
      do {
        puVar53 = &DAT_00165d70;
        uVar41 = 0;
        do {
          iVar32 = xmlMemBlocks();
          if (uVar8 < 4) {
            uVar48 = (&DAT_00165d70)[uVar8];
          }
          else {
            uVar48 = 0;
          }
          if (uVar47 < 4) {
            uVar40 = (&DAT_00165d70)[uVar47];
          }
          else {
            uVar40 = 0;
          }
          if (uVar41 < 4) {
            uVar39 = *puVar53;
          }
          else {
            uVar39 = 0;
          }
          xmlSAX2NotationDecl(0,uVar48,uVar40,uVar39);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar33 = xmlMemBlocks();
          if (iVar32 != iVar33) {
            iVar33 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2NotationDecl",(ulong)(uint)(iVar33 - iVar32));
            iVar31 = iVar31 + 1;
            printf(" %d",_test_ret_3);
            printf(" %d",(ulong)uVar8);
            printf(" %d",(ulong)uVar47);
            printf(" %d");
            putchar(10);
          }
          uVar41 = uVar41 + 1;
          puVar53 = puVar53 + 1;
        } while (uVar41 != 5);
        uVar47 = uVar47 + 1;
      } while (uVar47 != 5);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 5);
    iVar32 = (int)_test_ret_3;
    _test_ret_3 = (ulong)(iVar32 + 1);
  } while (iVar32 == 0);
  function_tests = function_tests + 1;
  test_ret_3 = 0;
  uVar46 = 0;
  do {
    uVar8 = 0;
    do {
      uVar47 = 0;
      puVar53 = &DAT_00165d70;
      do {
        iVar32 = xmlMemBlocks();
        if (uVar8 < 4) {
          uVar48 = (&DAT_00165d70)[uVar8];
        }
        else {
          uVar48 = 0;
        }
        if (uVar47 < 4) {
          uVar40 = *puVar53;
        }
        else {
          uVar40 = 0;
        }
        xmlSAX2ProcessingInstruction(0,uVar48,uVar40);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar33 = xmlMemBlocks();
        iVar34 = (int)uVar46;
        if (iVar32 != iVar33) {
          iVar33 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAX2ProcessingInstruction",
                 (ulong)(uint)(iVar33 - iVar32));
          test_ret_3 = test_ret_3 + 1;
          printf(" %d",uVar46);
          printf(" %d",(ulong)uVar8);
          printf(" %d");
          putchar(10);
        }
        uVar47 = uVar47 + 1;
        puVar53 = puVar53 + 1;
      } while (uVar47 != 5);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 5);
    uVar46 = (ulong)(iVar34 + 1);
  } while (iVar34 == 0);
  function_tests = function_tests + 1;
  iVar32 = 0;
  uVar46 = 0;
  do {
    puVar53 = &DAT_00165d70;
    uVar8 = 0;
    do {
      iVar33 = xmlMemBlocks();
      if (uVar8 < 4) {
        uVar48 = *puVar53;
      }
      else {
        uVar48 = 0;
      }
      xmlSAX2Reference(0,uVar48);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar34 = xmlMemBlocks();
      iVar35 = (int)uVar46;
      if (iVar33 != iVar34) {
        iVar34 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAX2Reference",(ulong)(uint)(iVar34 - iVar33));
        iVar32 = iVar32 + 1;
        printf(" %d",uVar46);
        printf(" %d");
        putchar(10);
      }
      uVar8 = uVar8 + 1;
      puVar53 = puVar53 + 1;
    } while (uVar8 != 5);
    uVar46 = (ulong)(iVar35 + 1);
  } while (iVar35 == 0);
  function_tests = function_tests + 1;
  iVar33 = 0;
  uVar46 = 0;
  do {
    uVar8 = 0;
    do {
      uVar47 = 0;
      puVar53 = &DAT_00165d70;
      do {
        iVar34 = xmlMemBlocks();
        if (uVar8 < 4) {
          uVar48 = (&DAT_00165d70)[uVar8];
        }
        else {
          uVar48 = 0;
        }
        if (uVar47 < 4) {
          uVar40 = *puVar53;
        }
        else {
          uVar40 = 0;
        }
        xmlSAX2ResolveEntity(0,uVar48,uVar40);
        xmlFreeInputStream();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar35 = xmlMemBlocks();
        iVar42 = (int)uVar46;
        if (iVar34 != iVar35) {
          iVar35 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAX2ResolveEntity",(ulong)(uint)(iVar35 - iVar34));
          iVar33 = iVar33 + 1;
          printf(" %d",uVar46);
          printf(" %d",(ulong)uVar8);
          printf(" %d");
          putchar(10);
        }
        uVar47 = uVar47 + 1;
        puVar53 = puVar53 + 1;
      } while (uVar47 != 5);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 5);
    uVar46 = (ulong)(iVar42 + 1);
  } while (iVar42 == 0);
  iVar1 = local_64 + (iVar1 != iVar2) + (uint)(iVar3 != iVar4) + iVar5 + iVar6 + test_ret_1 + iVar7
          + iVar9 + iVar10 + iVar11 + iVar12 + iVar13 + iVar14 + iVar15 + iVar16 + iVar17 + iVar18 +
          iVar19 + iVar20 + iVar21 + iVar22 + iVar23 + iVar24 + (uint)(iVar25 != iVar26) +
          (uint)(iVar27 != iVar28) + iVar29 + iVar30 + iVar31 + test_ret_3;
  function_tests = function_tests + 1;
  iVar3 = 0;
  iVar2 = 0;
  do {
    iVar4 = xmlMemBlocks();
    xmlSAX2SetDocumentLocator(0,0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2SetDocumentLocator",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 == 1);
  function_tests = function_tests + 1;
  uVar8 = 0;
  iVar2 = 0;
  do {
    iVar4 = xmlMemBlocks();
    xmlSAX2StartDocument(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2StartDocument",(ulong)(uint)(iVar5 - iVar4));
      iVar2 = iVar2 + 1;
      printf(" %d",(ulong)uVar8);
      putchar(10);
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 == 1);
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  uVar46 = 0;
  do {
    puVar53 = &DAT_00165d70;
    uVar8 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (uVar8 < 4) {
        uVar48 = *puVar53;
      }
      else {
        uVar48 = 0;
      }
      xmlSAX2StartElement(0,uVar48,0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      iVar6 = (int)uVar46;
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAX2StartElement",(ulong)(uint)(iVar5 - iVar4));
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",uVar46);
        printf(" %d");
        printf(" %d");
        putchar(10);
      }
      uVar8 = uVar8 + 1;
      puVar53 = puVar53 + 1;
    } while (uVar8 != 5);
    uVar46 = (ulong)(iVar6 + 1);
  } while (iVar6 == 0);
  function_tests = function_tests + 1;
  iVar4 = 0;
  _test_ret = 0;
  do {
    uVar8 = 0;
    do {
      uVar47 = 0;
      do {
        uVar46 = 0;
        do {
          uVar45 = 0;
          do {
            uVar54 = 0;
            do {
              uVar41 = 0;
              puVar44 = &DAT_00163454;
              do {
                iVar5 = xmlMemBlocks();
                if (uVar8 < 4) {
                  uVar48 = (&DAT_00165d70)[uVar8];
                }
                else {
                  uVar48 = 0;
                }
                if (uVar47 < 4) {
                  uVar40 = (&DAT_00165d70)[uVar47];
                }
                else {
                  uVar40 = 0;
                }
                if ((uint)uVar46 < 4) {
                  uVar39 = (&DAT_00165d70)[uVar46];
                }
                else {
                  uVar39 = 0;
                }
                uVar49 = 0xffffffff;
                uVar38 = 0xffffffff;
                if ((uint)uVar45 < 4) {
                  uVar38 = (&DAT_00163454)[uVar45];
                }
                if ((uint)uVar54 < 4) {
                  uVar49 = (&DAT_00163454)[uVar54];
                }
                uVar52 = 0xffffffff;
                if (uVar41 < 4) {
                  uVar52 = *puVar44;
                }
                xmlSAX2StartElementNs(0,uVar48,uVar40,uVar39,uVar38,0,uVar49,uVar52,0);
                call_tests = call_tests + 1;
                xmlResetLastError();
                iVar6 = xmlMemBlocks();
                if (iVar5 != iVar6) {
                  iVar6 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlSAX2StartElementNs",
                         (ulong)(uint)(iVar6 - iVar5));
                  iVar4 = iVar4 + 1;
                  printf(" %d",_test_ret);
                  printf(" %d",(ulong)uVar8);
                  printf(" %d",(ulong)uVar47);
                  printf(" %d",uVar46);
                  printf(" %d",uVar45);
                  printf(" %d",0);
                  printf(" %d",uVar54);
                  printf(" %d");
                  printf(" %d");
                  putchar(10);
                }
                uVar41 = uVar41 + 1;
                puVar44 = puVar44 + 1;
              } while (uVar41 != 4);
              uVar41 = (uint)uVar54 + 1;
              uVar54 = (ulong)uVar41;
            } while (uVar41 != 4);
            uVar41 = (uint)uVar45 + 1;
            uVar45 = (ulong)uVar41;
          } while (uVar41 != 4);
          uVar41 = (uint)uVar46 + 1;
          uVar46 = (ulong)uVar41;
        } while (uVar41 != 5);
        uVar47 = uVar47 + 1;
      } while (uVar47 != 5);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 5);
    iVar5 = (int)_test_ret;
    _test_ret = (ulong)(iVar5 + 1);
  } while (iVar5 == 0);
  function_tests = function_tests + 1;
  iVar5 = 0;
  _test_ret_3 = 0;
  do {
    uVar8 = 0;
    do {
      uVar46 = 0;
      do {
        uVar45 = 0;
        do {
          uVar47 = 0;
          puVar53 = &DAT_00165d70;
          do {
            iVar6 = xmlMemBlocks();
            if (uVar8 < 4) {
              uVar48 = (&DAT_00165d70)[uVar8];
            }
            else {
              uVar48 = 0;
            }
            if ((uint)uVar46 < 4) {
              uVar40 = (&DAT_00165d70)[uVar46];
            }
            else {
              uVar40 = 0;
            }
            if ((uint)uVar45 < 4) {
              uVar39 = (&DAT_00165d70)[uVar45];
            }
            else {
              uVar39 = 0;
            }
            if (uVar47 < 4) {
              uVar50 = *puVar53;
            }
            else {
              uVar50 = 0;
            }
            xmlSAX2UnparsedEntityDecl(0,uVar48,uVar40,uVar39,uVar50);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar7 = xmlMemBlocks();
            if (iVar6 != iVar7) {
              iVar7 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlSAX2UnparsedEntityDecl",
                     (ulong)(uint)(iVar7 - iVar6));
              iVar5 = iVar5 + 1;
              printf(" %d",_test_ret_3);
              printf(" %d",(ulong)uVar8);
              printf(" %d",uVar46);
              printf(" %d",uVar45);
              printf(" %d");
              putchar(10);
            }
            uVar47 = uVar47 + 1;
            puVar53 = puVar53 + 1;
          } while (uVar47 != 5);
          uVar47 = (uint)uVar45 + 1;
          uVar45 = (ulong)uVar47;
        } while (uVar47 != 5);
        uVar47 = (uint)uVar46 + 1;
        uVar46 = (ulong)uVar47;
      } while (uVar47 != 5);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 5);
    iVar6 = (int)_test_ret_3;
    _test_ret_3 = (ulong)(iVar6 + 1);
  } while (iVar6 == 0);
  function_tests = function_tests + 1;
  puVar44 = &DAT_00163454;
  uVar8 = 0;
  iVar6 = 0;
  do {
    iVar7 = xmlMemBlocks();
    uVar38 = 0xffffffff;
    if (uVar8 < 4) {
      uVar38 = *puVar44;
    }
    xmlSAXDefaultVersion(uVar38);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar7 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAXDefaultVersion",(ulong)(uint)(iVar9 - iVar7));
      iVar6 = iVar6 + 1;
      printf(" %d",(ulong)uVar8);
      putchar(10);
    }
    uVar8 = uVar8 + 1;
    puVar44 = puVar44 + 1;
  } while (uVar8 != 4);
  function_tests = function_tests + 1;
  puVar44 = &DAT_00163454;
  uVar8 = 0;
  iVar7 = 0;
  do {
    iVar9 = xmlMemBlocks();
    uVar38 = 0xffffffff;
    if (uVar8 < 4) {
      uVar38 = *puVar44;
    }
    xmlSAXVersion(0,uVar38);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAXVersion",(ulong)(uint)(iVar10 - iVar9));
      iVar7 = iVar7 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar8);
      putchar(10);
    }
    uVar8 = uVar8 + 1;
    puVar44 = puVar44 + 1;
  } while (uVar8 != 4);
  function_tests = function_tests + 1;
  uVar8 = iVar1 + iVar32 + iVar33 + iVar3 + iVar2 + test_ret_1 + iVar4 + iVar5 + iVar6 + iVar7;
  if (uVar8 != 0) {
    printf("Module SAX2: %d errors\n",(ulong)uVar8);
  }
  return uVar8;
}

Assistant:

static int
test_SAX2(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing SAX2 : 38 of 38 functions ...\n");
    test_ret += test_docbDefaultSAXHandlerInit();
    test_ret += test_htmlDefaultSAXHandlerInit();
    test_ret += test_xmlDefaultSAXHandlerInit();
    test_ret += test_xmlSAX2AttributeDecl();
    test_ret += test_xmlSAX2CDataBlock();
    test_ret += test_xmlSAX2Characters();
    test_ret += test_xmlSAX2Comment();
    test_ret += test_xmlSAX2ElementDecl();
    test_ret += test_xmlSAX2EndDocument();
    test_ret += test_xmlSAX2EndElement();
    test_ret += test_xmlSAX2EndElementNs();
    test_ret += test_xmlSAX2EntityDecl();
    test_ret += test_xmlSAX2ExternalSubset();
    test_ret += test_xmlSAX2GetColumnNumber();
    test_ret += test_xmlSAX2GetEntity();
    test_ret += test_xmlSAX2GetLineNumber();
    test_ret += test_xmlSAX2GetParameterEntity();
    test_ret += test_xmlSAX2GetPublicId();
    test_ret += test_xmlSAX2GetSystemId();
    test_ret += test_xmlSAX2HasExternalSubset();
    test_ret += test_xmlSAX2HasInternalSubset();
    test_ret += test_xmlSAX2IgnorableWhitespace();
    test_ret += test_xmlSAX2InitDefaultSAXHandler();
    test_ret += test_xmlSAX2InitDocbDefaultSAXHandler();
    test_ret += test_xmlSAX2InitHtmlDefaultSAXHandler();
    test_ret += test_xmlSAX2InternalSubset();
    test_ret += test_xmlSAX2IsStandalone();
    test_ret += test_xmlSAX2NotationDecl();
    test_ret += test_xmlSAX2ProcessingInstruction();
    test_ret += test_xmlSAX2Reference();
    test_ret += test_xmlSAX2ResolveEntity();
    test_ret += test_xmlSAX2SetDocumentLocator();
    test_ret += test_xmlSAX2StartDocument();
    test_ret += test_xmlSAX2StartElement();
    test_ret += test_xmlSAX2StartElementNs();
    test_ret += test_xmlSAX2UnparsedEntityDecl();
    test_ret += test_xmlSAXDefaultVersion();
    test_ret += test_xmlSAXVersion();

    if (test_ret != 0)
	printf("Module SAX2: %d errors\n", test_ret);
    return(test_ret);
}